

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

void src_float_to_short_array(float *in,short *out,int len)

{
  int iVar1;
  float x;
  int local_20;
  float scaled_value;
  int i;
  int len_local;
  short *out_local;
  float *in_local;
  
  for (local_20 = 0; local_20 < len; local_20 = local_20 + 1) {
    x = in[local_20] * 32768.0;
    if (x < 32767.0) {
      if (-32768.0 < x) {
        iVar1 = psf_lrintf(x);
        out[local_20] = (short)iVar1;
      }
      else {
        out[local_20] = -0x8000;
      }
    }
    else {
      out[local_20] = 0x7fff;
    }
  }
  return;
}

Assistant:

void
src_float_to_short_array (const float *in, short *out, int len)
{
	for (int i = 0 ; i < len ; i++)
	{	float scaled_value ;
		scaled_value = in [i] * 32768.f ;
		if (scaled_value >= 32767.f)
			out [i] = 32767 ;
		else if (scaled_value <= -32768.f)
			out [i] = -32768 ;
		else
			out [i] = (short) (psf_lrintf (scaled_value)) ;
	}
}